

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_0::CWriter::WriteElemTableInit
          (CWriter *this,bool active_initialization,ElemSegment *src_segment,Table *dst_table)

{
  Enum EVar1;
  pointer piVar2;
  pointer piVar3;
  size_t size;
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *extraout_RDX_01;
  Newline *u;
  char *pcVar4;
  ExternalInstancePtr local_38;
  
  EVar1 = (dst_table->elem_type).enum_;
  if (1 < (uint)(EVar1 + 0x11)) {
    __assert_fail("dst_table->elem_type == Type::FuncRef || dst_table->elem_type == Type::ExternRef"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                  ,0x773,
                  "void wabt::(anonymous namespace)::CWriter::WriteElemTableInit(bool, const ElemSegment *, const Table *)"
                 );
  }
  if (EVar1 == (src_segment->elem_type).enum_) {
    pcVar4 = "externref";
    if (EVar1 == FuncRef) {
      pcVar4 = "funcref";
    }
    local_38.super_GlobalName.type = Table;
    local_38.super_GlobalName.name = &dst_table->name;
    WriteData(this,pcVar4,(ulong)(EVar1 != FuncRef) * 2 + 7);
    WriteData(this,"_table_init(",0xc);
    Write(this,&local_38);
    WriteData(this,", ",2);
    if ((dst_table->elem_type).enum_ == FuncRef) {
      if ((src_segment->elem_exprs).
          super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (src_segment->elem_exprs).
          super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar4 = "NULL, ";
        size = 6;
      }
      else {
        WriteData(this,"elem_segment_exprs_",0x13);
        Write(this,(GlobalName *)0x6);
        pcVar4 = ", ";
        size = 2;
      }
      WriteData(this,pcVar4,size);
    }
    if (active_initialization) {
      Writef(this,"%u",
             (ulong)(uint)((int)((ulong)((long)(src_segment->elem_exprs).
                                               super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(src_segment->elem_exprs).
                                              super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555));
      WriteData(this,", ",2);
      WriteInitExpr(this,(ExprList *)(src_segment->offset).first_);
      piVar2 = (src_segment->elem_exprs).
               super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      piVar3 = (src_segment->elem_exprs).
               super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      WriteData(this,", 0, ",5);
      Writef(this,"%u",(ulong)(uint)((int)((ulong)((long)piVar2 - (long)piVar3) >> 3) * -0x55555555)
            );
      u = extraout_RDX;
    }
    else {
      pcVar4 = "0, ";
      if (src_segment->kind == Passive) {
        piVar2 = (src_segment->elem_exprs).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar3 = (src_segment->elem_exprs).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar2 != piVar3) {
          WriteData(this,"(instance->elem_segment_dropped_",0x20);
          Write(this,(GlobalName *)0x6);
          WriteData(this," ? 0 : ",7);
          Writef(this,"%u",
                 (ulong)(uint)((int)((ulong)((long)piVar3 - (long)piVar2) >> 3) * -0x55555555));
          pcVar4 = "), ";
        }
      }
      WriteData(this,pcVar4,3);
      Write(this,(StackVar *)0x2);
      WriteData(this,", ",2);
      Write(this,(StackVar *)0x1);
      WriteData(this,", ",2);
      Write(this,(StackVar *)0x0);
      u = extraout_RDX_00;
    }
    if ((dst_table->elem_type).enum_ == FuncRef) {
      WriteData(this,", instance",10);
      u = extraout_RDX_01;
    }
    (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [3])0x166a38,u);
    return;
  }
  __assert_fail("dst_table->elem_type == src_segment->elem_type",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x774,
                "void wabt::(anonymous namespace)::CWriter::WriteElemTableInit(bool, const ElemSegment *, const Table *)"
               );
}

Assistant:

void CWriter::WriteElemTableInit(bool active_initialization,
                                 const ElemSegment* src_segment,
                                 const Table* dst_table) {
  assert(dst_table->elem_type == Type::FuncRef ||
         dst_table->elem_type == Type::ExternRef);
  assert(dst_table->elem_type == src_segment->elem_type);

  Write(GetReferenceTypeName(dst_table->elem_type), "_table_init(",
        ExternalInstancePtr(ModuleFieldType::Table, dst_table->name), ", ");

  // elem segment exprs needed only for funcref tables
  // because externref tables can only be initialized with ref.null
  if (dst_table->elem_type == Type::FuncRef) {
    if (src_segment->elem_exprs.empty()) {
      Write("NULL, ");
    } else {
      Write("elem_segment_exprs_",
            GlobalName(ModuleFieldType::ElemSegment, src_segment->name), ", ");
    }
  }

  // src_size, dest_addr, src_addr, N
  if (active_initialization) {
    Write(src_segment->elem_exprs.size(), ", ");
    WriteInitExpr(src_segment->offset);
    Write(", 0, ", src_segment->elem_exprs.size());
  } else {
    if (is_droppable(src_segment)) {
      Write("(instance->elem_segment_dropped_",
            GlobalName(ModuleFieldType::ElemSegment, src_segment->name),
            " ? 0 : ", src_segment->elem_exprs.size(), "), ");
    } else {
      Write("0, ");
    }
    Write(StackVar(2), ", ", StackVar(1), ", ", StackVar(0));
  }

  if (dst_table->elem_type == Type::FuncRef) {
    Write(", instance");
  }

  Write(");", Newline());
}